

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O0

void __thiscall
Sampling_InvertUniformCone_Test::~Sampling_InvertUniformCone_Test
          (Sampling_InvertUniformCone_Test *this)

{
  void *in_RDI;
  
  ~Sampling_InvertUniformCone_Test((Sampling_InvertUniformCone_Test *)0x654718);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Sampling, InvertUniformCone) {
    RNG rng;
    for (Point2f u : Uniform2D(1000)) {
        Float cosThetaMax = rng.Uniform<Float>();
        Vector3f v = SampleUniformCone(u, cosThetaMax);
        Point2f up = InvertUniformConeSample(v, cosThetaMax);

        EXPECT_LT(std::abs(u.x - up.x), 1e-3) << "u " << u << " -> " << v << " -> " << up;
        EXPECT_LT(std::abs(u.y - up.y), 1e-3) << "u " << u << " -> " << v << " -> " << up;
    }
}